

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

ContinuousAssignSyntax * __thiscall
slang::parsing::Parser::parseContinuousAssign(Parser *this,AttrList attributes)

{
  bool bVar1;
  int iVar2;
  SourceLocation location;
  SyntaxNode *this_00;
  undefined4 extraout_var;
  ContinuousAssignSyntax *pCVar3;
  Info *extraout_RDX;
  Info *src;
  Token TVar4;
  SourceRange range;
  Token assign;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token local_1a0;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_190;
  uint local_180;
  size_type local_178;
  pointer local_170;
  size_type local_168;
  TimingControlSyntax *local_160;
  DriveStrengthSyntax *local_158;
  Info *local_150;
  undefined8 local_148;
  pointer local_140;
  Token local_138;
  SyntaxKind local_128;
  pointer local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  local_140 = attributes.data_;
  TVar4 = ParserBase::consume(&this->super_ParserBase);
  local_150 = TVar4.info;
  local_148 = TVar4._0_8_;
  local_158 = parseDriveStrength(this);
  local_160 = parseDelay3(this);
  Token::Token(&local_1a0);
  local_108[0].len = 0;
  local_108[0].cap = 8;
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_138 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(local_138.kind);
  if (bVar1) {
    location = Token::location(&local_138);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x260005,location);
    local_1a0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(local_138.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,local_138,Semicolon,&local_1a0,(DiagCode)0x260005);
      src = extraout_RDX;
      goto LAB_00327ad2;
    }
    do {
      local_138 = ParserBase::peek(&this->super_ParserBase);
      this_00 = &parseExpression(this)->super_SyntaxNode;
      if (this_00->kind != AssignmentExpression) {
        range = slang::syntax::SyntaxNode::sourceRange(this_00);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x260005,range);
      }
      local_190._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)this_00;
      local_180 = CONCAT31(local_180._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_108,(TokenOrSyntax *)&local_190._M_first);
      TVar4 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar4.kind);
      if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,Comma), !bVar1)) break;
      local_190._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           ParserBase::expect(&this->super_ParserBase,Comma);
      local_180 = local_180 & 0xffffff00;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_108,(TokenOrSyntax *)&local_190._M_first);
      TVar4 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar4.kind);
      if (bVar1) {
        ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
        break;
      }
      TVar4 = ParserBase::peek(&this->super_ParserBase);
    } while (((local_138.kind != TVar4.kind) ||
             ((SyntaxNode *)local_138.info != (SyntaxNode *)TVar4.info)) ||
            (bVar1 = ParserBase::
                     skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                               (&this->super_ParserBase,(DiagCode)0x260005,true), bVar1));
    local_1a0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  src = local_1a0.info;
LAB_00327ad2:
  local_180 = 1;
  local_170 = local_140;
  local_190 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
              ZEXT816(0x4ea348);
  local_178 = attributes.size_;
  local_168 = attributes.size_;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_118 = (pointer)CONCAT44(extraout_var,iVar2);
  local_128 = SeparatedList;
  local_138 = (Token)ZEXT816(0x4ed090);
  assign.info = local_150;
  assign.kind = (undefined2)local_148;
  assign._2_1_ = local_148._2_1_;
  assign.numFlags.raw = local_148._3_1_;
  assign.rawLen = local_148._4_4_;
  pCVar3 = slang::syntax::SyntaxFactory::continuousAssign
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_190._M_first,
                      assign,local_158,local_160,
                      (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&local_138,local_1a0);
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    free(local_108[0].data_);
  }
  return pCVar3;
}

Assistant:

ContinuousAssignSyntax& Parser::parseContinuousAssign(AttrList attributes) {
    auto assign = consume();
    auto strength = parseDriveStrength();
    auto delay = parseDelay3();

    Token semi;
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleExpressionOrComma, isSemicolon>(
        buffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
        diag::ExpectedContinuousAssignment, [this] {
            auto& expr = parseExpression();
            if (expr.kind != SyntaxKind::AssignmentExpression)
                addDiag(diag::ExpectedContinuousAssignment, expr.sourceRange());
            return &expr;
        });

    return factory.continuousAssign(attributes, assign, strength, delay, buffer.copy(alloc), semi);
}